

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console_reporter.cc
# Opt level: O0

void __thiscall
benchmark::ConsoleReporter::ReportRuns
          (ConsoleReporter *this,
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          *reports)

{
  bool bVar1;
  __type_conflict _Var2;
  const_reference __lhs;
  size_type sVar3;
  undefined1 local_138 [8];
  Run stddev_data;
  Run mean_data;
  CheckHandler local_40;
  reference local_38;
  Run *run;
  const_iterator __end1;
  const_iterator __begin1;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *__range1;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *reports_local;
  ConsoleReporter *this_local;
  
  bVar1 = std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::empty(reports);
  if (!bVar1) {
    __end1 = std::
             vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             ::begin(reports);
    run = (Run *)std::
                 vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                 ::end(reports);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                                       *)&run), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                 ::operator*(&__end1);
      __lhs = std::
              vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
              ::operator[](reports,0);
      _Var2 = std::operator==(&__lhs->benchmark_name,&local_38->benchmark_name);
      if (!_Var2) {
        internal::CheckHandler::CheckHandler
                  (&local_40,"(reports[0].benchmark_name) == (run.benchmark_name)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/console_reporter.cc"
                   ,"ReportRuns",0x3f);
        internal::CheckHandler::GetLog(&local_40);
        internal::CheckHandler::~CheckHandler(&local_40);
      }
      internal::GetNullLogInstance();
      (*(this->super_BenchmarkReporter)._vptr_BenchmarkReporter[5])(this,local_38);
      __gnu_cxx::
      __normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
      ::operator++(&__end1);
    }
    sVar3 = std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::size(reports);
    if (1 < sVar3) {
      BenchmarkReporter::Run::Run((Run *)&stddev_data.max_heapbytes_used);
      BenchmarkReporter::Run::Run((Run *)local_138);
      BenchmarkReporter::ComputeStats
                (reports,(Run *)&stddev_data.max_heapbytes_used,(Run *)local_138);
      (*(this->super_BenchmarkReporter)._vptr_BenchmarkReporter[5])
                (this,&stddev_data.max_heapbytes_used);
      (*(this->super_BenchmarkReporter)._vptr_BenchmarkReporter[5])(this,local_138);
      BenchmarkReporter::Run::~Run((Run *)local_138);
      BenchmarkReporter::Run::~Run((Run *)&stddev_data.max_heapbytes_used);
    }
  }
  return;
}

Assistant:

void ConsoleReporter::ReportRuns(const std::vector<Run>& reports) {
  if (reports.empty()) {
    return;
  }

  for (Run const& run : reports) {
    CHECK_EQ(reports[0].benchmark_name, run.benchmark_name);
    PrintRunData(run);
  }

  if (reports.size() < 2) {
    // We don't report aggregated data if there was a single run.
    return;
  }

  Run mean_data;
  Run stddev_data;
  BenchmarkReporter::ComputeStats(reports, &mean_data, &stddev_data);

  // Output using PrintRun.
  PrintRunData(mean_data);
  PrintRunData(stddev_data);
}